

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcrcell.c
# Opt level: O3

LispPTR gcreccell(LispPTR cell)

{
  ushort uVar1;
  DLword *pDVar2;
  uint uVar3;
  LispPTR LVar4;
  LispPTR LVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint ptr;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint *puVar13;
  short to_do_offset [1000];
  LispPTR to_do [1000];
  ulong local_17b8;
  long local_17b0;
  short asStack_17a8 [1000];
  uint auStack_fd8 [1002];
  ulong uVar9;
  
  uVar6 = (ulong)cell;
  uVar7 = 0xffffffff;
  local_17b8 = 0;
  uVar9 = 0;
LAB_00125180:
  do {
    uVar10 = uVar9;
    pDVar2 = Lisp_world;
    uVar8 = (uint)uVar10;
    uVar11 = (uint)uVar6;
    if ((uVar11 & 0xfff0000) == 0x60000) {
      error("freeing an old atom??");
    }
    ptr = uVar11 & 0xfffffffe;
    uVar9 = (ulong)ptr;
    uVar1 = *(ushort *)((ulong)((uint)(uVar6 >> 8) & 0xfffffe) + (long)MDStypetbl ^ 2);
    uVar12 = uVar1 & 0x7ff;
    uVar3 = (uint)local_17b8;
    if (uVar12 - 0x40 < 10) {
      if (uVar7 == 0xffffffff) {
        LVar4 = reclaimcodeblock(ptr);
        goto LAB_00125303;
      }
      goto LAB_001251d9;
    }
    if (uVar12 < 8) {
      if ((uVar1 & 0x7ff) == 0) {
        if (uVar7 == 0xffffffff) {
          LVar4 = reclaimarrayblock(ptr);
          goto LAB_00125303;
        }
LAB_001251d9:
        local_17b0 = (long)DTDspace + (ulong)uVar12 * 4 + (ulong)(uVar12 << 5);
        LVar4 = *(LispPTR *)(local_17b0 + 0x14);
        if (uVar7 != 0xffffffff) {
          do {
            LVar4 = cdr(LVar4);
            LVar5 = car(LVar4);
          } while ((LVar5 & 0xffff) != uVar7 * 2);
        }
        goto LAB_00125330;
      }
      if (uVar12 != 5) goto LAB_001251d9;
      puVar13 = (uint *)(pDVar2 + uVar9);
      uVar11 = *puVar13;
      if ((ulong)uVar11 < 0x10000000) {
        freelistcell(ptr);
        if ((uVar11 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
        }
        puVar13 = (uint *)(Lisp_world + uVar11);
        uVar9 = (ulong)uVar11;
        uVar11 = *puVar13;
      }
      pDVar2 = MDStypetbl;
      LVar4 = (LispPTR)uVar9;
      if (((uVar7 != 0xffffffff) ||
          (LVar5 = car(LVar4), *(short *)((ulong)(pDVar2 + (LVar5 >> 9)) ^ 2) < 0)) ||
         (*GcDisabled_word == 0x4c)) {
LAB_0012528c:
        pDVar2 = MDStypetbl;
        LVar5 = cdr(LVar4);
        uVar7 = 0;
        if ((-1 < *(short *)((ulong)(pDVar2 + (LVar5 >> 9)) ^ 2)) &&
           (uVar7 = 0, *GcDisabled_word != 0x4c)) {
          LVar5 = cdr(LVar4);
          uVar7 = rec_htfind(LVar5,1);
        }
        uVar6 = (ulong)uVar7;
        if (-1 < (int)uVar11) {
          freelistcell((uVar11 >> 0x1b & 0xe) + LVar4);
        }
        freelistcell(LVar4);
        goto LAB_0012541e;
      }
      LVar5 = car(LVar4);
      LVar5 = rec_htfind(LVar5,1);
      if (LVar5 == 0) goto LAB_0012528c;
      uVar6 = (ulong)LVar5;
      *puVar13 = uVar11 & 0xf0000000 | uVar8 & 0xfffffff;
      uVar10 = uVar9;
    }
    else {
      if (uVar12 == 8) {
        if (uVar7 != 0xffffffff) goto LAB_001251d9;
        LVar4 = reclaimstackp(ptr);
      }
      else {
        if ((uVar12 != 10) || (uVar7 != 0xffffffff)) goto LAB_001251d9;
        LVar4 = releasingvmempage(ptr);
      }
LAB_00125303:
      if (LVar4 != 0) {
LAB_00125426:
        if (uVar8 == 0) {
          if (uVar3 == 0) {
            return 0;
          }
          local_17b8 = (ulong)(uVar3 - 1);
          uVar6 = (ulong)auStack_fd8[local_17b8];
          uVar7 = (uint)asStack_17a8[local_17b8];
          todo_reads = todo_reads + 1;
          uVar9 = 0;
        }
        else {
          if ((uVar10 & 1) != 0) {
            printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
          }
          uVar7 = *(uint *)(Lisp_world + uVar10) >> 0x1c;
          uVar9 = (ulong)(*(uint *)(Lisp_world + uVar10) & 0xfffffff);
          uVar6 = uVar10;
        }
        goto LAB_00125180;
      }
      local_17b0 = (long)DTDspace + (ulong)uVar12 * 4 + (ulong)(uVar12 << 5);
      LVar4 = *(LispPTR *)(local_17b0 + 0x14);
LAB_00125330:
      do {
        if (LVar4 == 0) {
          uVar6 = 0;
          goto LAB_001253fd;
        }
        LVar5 = car(LVar4);
        LVar4 = cdr(LVar4);
        pDVar2 = MDStypetbl;
        uVar7 = (LVar5 & 0xffff) + ptr;
        if ((LVar5 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
        }
        uVar12 = *(uint *)(Lisp_world + uVar7);
        uVar6 = 0;
        if ((-1 < *(short *)((long)pDVar2 + (ulong)(uVar12 >> 8 & 0xffffe) ^ 2)) &&
           (*GcDisabled_word != 0x4c)) {
          if ((LVar5 & 1) != 0) {
            printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar7);
            uVar12 = *(uint *)(Lisp_world + uVar7);
          }
          LVar5 = rec_htfind(uVar12 & 0xfffffff,1);
          uVar6 = (ulong)LVar5;
        }
      } while ((int)uVar6 == 0);
      if (LVar4 == 0) {
LAB_001253fd:
        *(undefined4 *)(Lisp_world + uVar9) = *(undefined4 *)(local_17b0 + 8);
        *(uint *)(local_17b0 + 8) = uVar11 & 0xffffffe;
LAB_0012541e:
        if ((int)uVar6 == 0) goto LAB_00125426;
      }
      else {
        LVar5 = car(LVar4);
        pDVar2 = Lisp_world;
        if ((LVar5 & 0xfffe) < 0x1e) {
          *(uint *)(Lisp_world + uVar9) =
               *(uint *)(Lisp_world + uVar9) & 0xf0000000 | uVar8 & 0xfffffff;
          LVar4 = car(LVar4);
          *(uint *)(pDVar2 + uVar9) =
               *(uint *)(pDVar2 + uVar9) & 0xfffffff | (LVar4 & 0xfffffffe) << 0x1b;
          uVar10 = uVar9;
        }
        else if (uVar3 < 1000) {
          if (0xfffffff < uVar11) {
            error("illegal ptr in addtodo");
          }
          auStack_fd8[local_17b8] = ptr;
          LVar4 = car(LVar4);
          asStack_17a8[local_17b8] = (short)((LVar4 & 0xffff) >> 1);
          todo_uses = todo_uses + 1;
          local_17b8 = (ulong)(uVar3 + 1);
        }
        else {
          todo_misses = todo_misses + 1;
        }
      }
    }
    uVar7 = 0xffffffff;
    uVar9 = uVar10;
    if ((-1 < *(short *)((ulong)((uint)(uVar6 >> 8) & 0xfffffe) + (long)MDStypetbl ^ 2)) &&
       (*GcDisabled_word != 0x4c)) {
      rec_htfind((LispPTR)uVar6,0);
      uVar7 = 0xffffffff;
    }
  } while( true );
}

Assistant:

LispPTR gcreccell(LispPTR cell) {
  ConsCell *ptr;
  struct dtd *typdtd;
  DLword typ;
  LispPTR tmpptr, donext, tmpcell, val;
  LispPTR ptrfield, carfield;
  int index, code;
  LispPTR *field;

#ifdef NEWCDRCODING
  LispPTR to_do[TODO_LIMIT];      /* table of pointers to follow, since Cdr coding lost */
  short to_do_offset[TODO_LIMIT]; /* offset in datatype */
  unsigned do_count = 0;          /* counter of entries in to_do table */
#endif                            /* NEWCDRCODING */

  val = NIL;
  tmpptr = cell;
  index = -1;
  donext = NIL;
lp:
  ptr = (ConsCell *)NativeAligned4FromLAddr(tmpptr & -2);
/* # ifdef CHECK
  if (refcnt(tmpptr) != 1) error("reclaiming cell w/refcnt not 1");
 # endif
*/
#ifdef DEBUG
  if (tmpptr & 1) error("Reclaiming cell pointer with low bit 1.");
#else
  tmpptr &= -2; /* turn off low bit of pointer, so we never reclaim odd'ns */
#endif

  if ((tmpptr & 0x0FFF0000) == 0x60000) error("freeing an old atom??");

  typ = GetTypeNumber(tmpptr);
#ifdef DEBUG
  if (typ == 6) printf("Reclaiming array ptr 0x%x.\n", tmpptr);
#endif
  switch (typ) {
    case TYPE_LISTP: {
      if ((code = ptr->cdr_code) == CDR_INDIRECT) /* indirect */
      {
        tmpcell = ptr->car_field; /* Monitor */
        freelistcell(tmpptr);
        ptr = (ConsCell *)NativeAligned4FromLAddr(tmpcell);
        tmpptr = tmpcell;
        code = ptr->cdr_code;
      }
      if (index != -1) /* car part */
        index = -1;
      else {
        REC_GCLOOKUPV(car(tmpptr), DELREF, val);
        if (val != NIL) {
          ptr->car_field = donext;
          ptr->cdr_code = code;
          donext = tmpptr;
          goto doval;
        }
      }
      REC_GCLOOKUPV(cdr(tmpptr), DELREF, val);
      if (code <= CDR_MAXINDIRECT) {
#ifdef NEWCDRCODING
        tmpcell = tmpptr + ((code - CDR_INDIRECT) << 1);
#else
        tmpcell = POINTER_PAGEBASE(tmpptr) + ((code - CDR_INDIRECT) << 1);
#endif /* NEWCDRCODING */
        freelistcell(tmpcell);
      }
      freelistcell(tmpptr);
      goto doval;
    }
    case TYPE_ARRAYBLOCK:
      if ((index == -1) && reclaimarrayblock(tmpptr))
        goto trynext;
      else
        break;
    case TYPE_STACKP:
      if ((index == -1) && reclaimstackp(tmpptr)) goto trynext;
      break;
    case TYPE_VMEMPAGEP:
      if ((index == -1) && releasingvmempage(tmpptr)) {
        goto trynext;
      } else
        break;
    case TYPE_CODEHUNK1:
    case TYPE_CODEHUNK2:
    case TYPE_CODEHUNK3:
    case TYPE_CODEHUNK4:
    case TYPE_CODEHUNK5:
    case TYPE_CODEHUNK6:
    case TYPE_CODEHUNK7:
    case TYPE_CODEHUNK8:
    case TYPE_CODEHUNK9:
    case TYPE_CODEHUNK10:
      if ((index == -1) && reclaimcodeblock(tmpptr))
        goto trynext;
      else
        break;
    default:;
  }
normal:
  typdtd = (struct dtd *)GetDTD(typ);
  ptrfield = typdtd->dtd_ptrs;
  if (index != -1) {
    index = (index << 1);
    ptrfield = cdr(ptrfield);
    while ((car(ptrfield) & 0x0ffff) != index) ptrfield = cdr(ptrfield);
    index = -1;
  }
  while (ptrfield != NIL) {
    carfield = car(ptrfield);
    ptrfield = cdr(ptrfield);
    carfield &= 0x0ffff;
    REC_GCLOOKUPV((POINTERMASK & *(LispPTR *)NativeAligned4FromLAddr(tmpptr + carfield)), DELREF, val);
#ifndef NEWCDRCODING
    if (val != NIL) {
      if (ptrfield != NIL) {
        ptr = (ConsCell *)NativeAligned4FromLAddr(tmpptr);
        ptr->car_field = donext;
        ptr->cdr_code = ((car(ptrfield) & 0x0ffff) >> 1);
        donext = tmpptr;
        goto doval;
      } else
        goto addtofreelist;
    }
#else
    if (val != NIL) {
      if (ptrfield != NIL) {
        if ((carfield = car(ptrfield) & 0x0ffff) >> 1 < 15) {
          ptr = (ConsCell *)NativeAligned4FromLAddr(tmpptr);
          ptr->car_field = donext;
          ptr->cdr_code = ((car(ptrfield) & 0x0ffff) >> 1);
          donext = tmpptr;
          goto doval;
        } else {
          ADD_TO_DO(tmpptr, (car(ptrfield) & 0xffff) >> 1);
          goto doval;
        }
      } else
        goto addtofreelist;
    }
#endif /* NEWCDRCODING */
  }
addtofreelist:
  field = (LispPTR *)NativeAligned4FromLAddr(tmpptr);
  *field = typdtd->dtd_free;
  typdtd->dtd_free = tmpptr & POINTERMASK;
#ifdef DTDDEBUG
  check_dtd_chain(GetTypeNumber(tmpptr & POINTERMASK));
#endif

/******************************/
/*								*/
/*  Freeing one cell made another cell's refcnt = 0. */
/*  ADDREF the second cell (to remove it from the GC table) */
/*  and reclaim it.				*/
/************************************************************/
doval:
  if (val != NIL) {
    tmpptr = val;
    REC_GCLOOKUP(tmpptr, ADDREF);
    /*	GCLOOKUP(0x8000, ADDREF,tmpptr); */
    val = NIL;
    goto lp;
  }

/***************************************************************/
/*									*/
/*  Finished freeing the main cell, but we may have saved other */
/*  cells whose refcnt's went to 0 along the way.  This is      */
/*  where we work down the list of saved items to free.         */
/*									*/
/****************************************************************/
trynext:
  if (donext != NIL) {
    tmpptr = donext;
    ptr = (ConsCell *)NativeAligned4FromLAddr(tmpptr);
    donext = (LispPTR)ptr->car_field;
    index = ptr->cdr_code;
    goto lp;
  }
#ifdef NEWCDRCODING
  if (do_count) /* If there are other cells to collect */
  {
    do_count--;
    tmpptr = to_do[do_count];
    index = to_do_offset[do_count];
    todo_reads++;
    /*REC_GCLOOKUP(tmpptr, ADDREF); */
    goto lp;
  }
#endif /*NEWCDRCODING */
  return (NIL);
}